

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O0

void ZXing::Pdf417::RotateArray
               (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                *input,vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       *output)

{
  const_reference __x;
  vector<bool,_std::allocator<bool>_> *pvVar1;
  size_type sVar2;
  undefined1 *__n;
  vector<bool,_std::allocator<bool>_> *in_RSI;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *in_RDI;
  size_t jj;
  size_t inverseii;
  size_t ii;
  size_t i;
  size_t width;
  size_t height;
  reference local_50;
  ulong local_40;
  size_type in_stack_ffffffffffffffc8;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *in_stack_ffffffffffffffd0;
  vector<bool,_std::allocator<bool>_> *this;
  ulong local_28;
  
  pvVar1 = (vector<bool,_std::allocator<bool>_> *)
           std::
           vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ::size(in_RDI);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::operator[](in_RDI,0);
  sVar2 = std::vector<bool,_std::allocator<bool>_>::size(in_RSI);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  for (local_28 = 0; local_28 < sVar2; local_28 = local_28 + 1) {
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  *)in_RSI,local_28);
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)input,(size_type)output,height._7_1_);
  }
  for (this = (vector<bool,_std::allocator<bool>_> *)0x0; this < pvVar1;
      this = (vector<bool,_std::allocator<bool>_> *)
             ((long)&(this->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1)) {
    __n = (undefined1 *)((long)pvVar1 + (-1 - (long)this));
    for (local_40 = 0; local_40 < sVar2; local_40 = local_40 + 1) {
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::operator[](in_RDI,(size_type)this);
      __x = std::vector<bool,_std::allocator<bool>_>::operator[](this,(size_type)__n);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    *)in_RSI,local_40);
      local_50 = std::vector<bool,_std::allocator<bool>_>::operator[](this,(size_type)__n);
      std::_Bit_reference::operator=(&local_50,__x);
    }
  }
  return;
}

Assistant:

static void RotateArray(const std::vector<std::vector<bool>>& input, std::vector<std::vector<bool>>& output)
{
	size_t height = input.size();
	size_t width = input[0].size();
	output.resize(width);
	for (size_t i = 0; i < width; ++i) {
		output[i].resize(height);
	}
	for (size_t ii = 0; ii < height; ++ii) {
		// This makes the direction consistent on screen when rotating the screen
		size_t inverseii = height - ii - 1;
		for (size_t jj = 0; jj < width; ++jj) {
			output[jj][inverseii] = input[ii][jj];
		}
	}
}